

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat3x4.c
# Opt level: O0

void glmc_mat3x4_zero(vec4 *m)

{
  undefined4 *in_RDI;
  mat3x4 t;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 *local_48;
  
  local_48 = in_RDI;
  memset(&local_78,0,0x30);
  *local_48 = local_78;
  local_48[1] = local_74;
  local_48[2] = local_70;
  local_48[3] = local_6c;
  local_48[4] = local_68;
  local_48[5] = local_64;
  local_48[6] = local_60;
  local_48[7] = local_5c;
  local_48[8] = local_58;
  local_48[9] = local_54;
  local_48[10] = local_50;
  local_48[0xb] = local_4c;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_mat3x4_zero(mat3x4 m) {
  glm_mat3x4_zero(m);
}